

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O1

string * __thiscall
soul::heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
          (string *__return_storage_ptr__,Utilities *this,ArrayView<soul::Type> types,
          bool alwaysParenthesise)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  ulong uVar4;
  long lVar5;
  undefined7 in_register_00000081;
  Type *pTVar6;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  pTVar6 = types.s;
  if ((int)types.e == 0) {
    if ((Type *)this == pTVar6) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    if ((long)pTVar6 - (long)this == 0x18) {
      Type::getDescription_abi_cxx11_(__return_storage_ptr__,(Type *)this);
      return __return_storage_ptr__;
    }
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,", ","",types.e,CONCAT71(in_register_00000081,alwaysParenthesise));
  if ((Type *)this == pTVar6) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
  }
  else {
    Type::getDescription_abi_cxx11_(&local_90,(Type *)this);
    uVar4 = ((long)pTVar6 - (long)this >> 3) * -0x5555555555555555;
    if (1 < uVar4) {
      lVar5 = uVar4 - 1;
      pTVar6 = (Type *)(this + 0x18);
      do {
        std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0[0]);
        Type::getDescription_abi_cxx11_(&local_50,pTVar6);
        std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = pTVar6 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  }
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x288ebc);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar3) {
    lVar5 = plVar1[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getDescriptionOfTypeList (ArrayView<Type> types, bool alwaysParenthesise)
    {
        if (! alwaysParenthesise)
        {
            if (types.empty())
                return {};

            if (types.size() == 1)
                return types.front().getDescription();
        }

        return "(" + joinStrings (types, ", ", [] (auto& t) { return t.getDescription(); }) + ")";
    }